

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

Uint32 anon_unknown.dwarf_42c354::RenderTargetImpl::factorToGlConstant(Factor blendFactor)

{
  ostream *poVar1;
  
  if (blendFactor < (DstAlpha|SrcColor)) {
    return *(Uint32 *)(&DAT_001f57a4 + (ulong)blendFactor * 4);
  }
  poVar1 = sf::err();
  poVar1 = std::operator<<(poVar1,
                           "Invalid value for sf::BlendMode::Factor! Fallback to sf::BlendMode::Zero."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

sf::Uint32 factorToGlConstant(sf::BlendMode::Factor blendFactor)
        {
            switch (blendFactor)
            {
                case sf::BlendMode::Zero:             return GL_ZERO;
                case sf::BlendMode::One:              return GL_ONE;
                case sf::BlendMode::SrcColor:         return GL_SRC_COLOR;
                case sf::BlendMode::OneMinusSrcColor: return GL_ONE_MINUS_SRC_COLOR;
                case sf::BlendMode::DstColor:         return GL_DST_COLOR;
                case sf::BlendMode::OneMinusDstColor: return GL_ONE_MINUS_DST_COLOR;
                case sf::BlendMode::SrcAlpha:         return GL_SRC_ALPHA;
                case sf::BlendMode::OneMinusSrcAlpha: return GL_ONE_MINUS_SRC_ALPHA;
                case sf::BlendMode::DstAlpha:         return GL_DST_ALPHA;
                case sf::BlendMode::OneMinusDstAlpha: return GL_ONE_MINUS_DST_ALPHA;
            }

            sf::err() << "Invalid value for sf::BlendMode::Factor! Fallback to sf::BlendMode::Zero." << std::endl;
            assert(false);
            return GL_ZERO;
        }